

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* dgrminer::combinations
            (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,vector<int,_std::allocator<int>_> *input,
            size_t combination_size)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  const_reference __x;
  iterator iVar4;
  iterator iVar5;
  reference rVar6;
  iterator iVar7;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  reference local_100;
  int local_ec;
  undefined1 local_e8 [4];
  int i;
  vector<int,_std::allocator<int>_> result;
  iterator local_a8;
  _Bit_type *local_98;
  uint local_90;
  _Bit_type *local_88;
  uint local_80;
  _Bit_type *local_78;
  uint local_70;
  allocator<bool> local_51;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> v;
  size_t combination_size_local;
  vector<int,_std::allocator<int>_> *input_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *results;
  
  v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage.
  _7_1_ = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(input);
  std::allocator<bool>::allocator(&local_51);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_50,sVar2,&local_51);
  std::allocator<bool>::~allocator(&local_51);
  iVar4 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)local_50);
  local_88 = iVar4.super__Bit_iterator_base._M_p;
  local_80 = iVar4.super__Bit_iterator_base._M_offset;
  local_78 = local_88;
  local_70 = local_80;
  iVar4 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)local_50);
  local_a8.super__Bit_iterator_base._M_p = iVar4.super__Bit_iterator_base._M_p;
  local_a8.super__Bit_iterator_base._M_offset = iVar4.super__Bit_iterator_base._M_offset;
  iVar5 = std::operator+(&local_a8,combination_size);
  local_98 = iVar5.super__Bit_iterator_base._M_p;
  local_90 = iVar5.super__Bit_iterator_base._M_offset;
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  __first.super__Bit_iterator_base._M_offset = local_70;
  __first.super__Bit_iterator_base._M_p = local_78;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar5.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar5.super__Bit_iterator_base._0_12_,8);
  std::fill<std::_Bit_iterator,bool>
            (__first,__last,
             (bool *)((long)&result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
  do {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_e8);
    local_ec = 0;
    while( true ) {
      uVar3 = (ulong)local_ec;
      sVar2 = std::vector<int,_std::allocator<int>_>::size(input);
      if (sVar2 <= uVar3) break;
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_50,(long)local_ec);
      local_100 = rVar6;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_100);
      if (bVar1) {
        __x = std::vector<int,_std::allocator<int>_>::operator[](input,(long)local_ec);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_e8,__x);
      }
      local_ec = local_ec + 1;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_e8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e8);
    iVar4 = std::vector<bool,_std::allocator<bool>_>::begin
                      ((vector<bool,_std::allocator<bool>_> *)local_50);
    iVar7 = std::vector<bool,_std::allocator<bool>_>::end
                      ((vector<bool,_std::allocator<bool>_> *)local_50);
    __first_00.super__Bit_iterator_base._12_4_ = 0;
    __first_00.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(iVar4.super__Bit_iterator_base._0_12_,0);
    __first_00.super__Bit_iterator_base._M_offset = SUB124(iVar4.super__Bit_iterator_base._0_12_,8);
    __last_00.super__Bit_iterator_base._12_4_ = 0;
    __last_00.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(iVar7.super__Bit_iterator_base._0_12_,0);
    __last_00.super__Bit_iterator_base._M_offset = SUB124(iVar7.super__Bit_iterator_base._0_12_,8);
    bVar1 = std::prev_permutation<std::_Bit_iterator>(__first_00,__last_00);
  } while (bVar1);
  v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage.
  _7_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_50)
  ;
  if ((v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<std::vector<int>> combinations(
		const std::vector<int>& input,
		size_t combination_size
	) {
	  	std::vector<std::vector<int>> results;
	  	std::vector<bool> v(input.size());
	  	std::fill(v.begin(), v.begin() + combination_size, true);

	  	do {
			std::vector<int> result;
			for (int i = 0; i < input.size(); ++i) {
		  		if (v[i]) {
					result.push_back(input[i]);
				}
		  	}
			results.push_back(result);
		} while (std::prev_permutation(v.begin(), v.end()));

	  	return results;
	}